

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::ClientContext::ExtractPlan(ClientContext *this,string *query)

{
  type lock_00;
  InvalidInputException *this_00;
  string *in_RDX;
  string *lock_01;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  undefined1 auStack_68 [8];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_40;
  
  LockContext((ClientContext *)auStack_68);
  lock_00 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
            ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                         *)auStack_68);
  lock_01 = query;
  ParseStatementsInternal
            ((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
              *)&local_40,(ClientContext *)query,lock_00,in_RDX);
  if ((long)local_40.
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_40.
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
    operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
               *)auStack_68);
    local_60._8_8_ = (element_type *)0x0;
    local_60._0_8_ = operator_new(0x18);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._0_8_)->_vptr__Sp_counted_base =
         (_func_int **)query;
    *(vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._0_8_)->_M_use_count = &local_40
    ;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._0_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)this;
    local_50._8_8_ =
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:661:42)>
         ::_M_invoke;
    local_50._0_8_ =
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:661:42)>
         ::_M_manager;
    RunFunctionInTransactionInternal
              ((ClientContext *)query,(ClientContextLock *)lock_01,
               (function<void_()> *)(auStack_68 + 8),true);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_50._0_8_)(auStack_68 + 8,auStack_68 + 8,3);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector(&local_40);
    ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
    ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
                 *)auStack_68);
    return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60._0_8_ = auStack_68 + 0x18;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(auStack_68 + 8),"ExtractPlan can only prepare a single statement","");
  InvalidInputException::InvalidInputException(this_00,(string *)(auStack_68 + 8));
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<LogicalOperator> ClientContext::ExtractPlan(const string &query) {
	auto lock = LockContext();

	auto statements = ParseStatementsInternal(*lock, query);
	if (statements.size() != 1) {
		throw InvalidInputException("ExtractPlan can only prepare a single statement");
	}

	unique_ptr<LogicalOperator> plan;
	RunFunctionInTransactionInternal(*lock, [&]() {
		Planner planner(*this);
		planner.CreatePlan(std::move(statements[0]));
		D_ASSERT(planner.plan);

		plan = std::move(planner.plan);

		if (config.enable_optimizer) {
			Optimizer optimizer(*planner.binder, *this);
			plan = optimizer.Optimize(std::move(plan));
		}

		ColumnBindingResolver resolver;
		resolver.Verify(*plan);
		resolver.VisitOperator(*plan);

		plan->ResolveOperatorTypes();
	});
	return plan;
}